

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O2

void __thiscall crnlib::well512::seed(well512 *this,uint32 seed)

{
  uint uVar1;
  uint i;
  long lVar2;
  
  uVar1 = seed ^ 0x7793c2aa;
  uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    uVar1 = uVar1 << 0x11 ^ uVar1;
    uVar1 = uVar1 >> 0xd ^ uVar1;
    uVar1 = uVar1 << 5 ^ uVar1;
    seed = bitmix32c(seed);
    this->m_state[lVar2] = seed ^ uVar1;
  }
  this->m_index = 0;
  return;
}

Assistant:

void well512::seed(uint32 seed) {
  uint32 jsr = utils::swap32(seed) ^ 0xAAC29377;

  for (uint i = 0; i < cStateSize; i++) {
    SHR3;
    seed = bitmix32c(seed);

    m_state[i] = seed ^ jsr;
  }
  m_index = 0;
}